

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_3::ButtonBase::~ButtonBase(ButtonBase *this)

{
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__ButtonBase_00167e30;
  std::_Function_base::~_Function_base(&(this->on_click_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->label_);
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

ButtonBase(ConstStringRef label,
             std::function<void()> on_click,
             Ref<ButtonOption> option)
      : label_(label), on_click_(on_click), option_(std::move(option)) {}